

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_cmps(DisasContext *s,MemOp ot)

{
  MemOp MVar1;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGContext *pTVar2;
  TCGArg a2;
  TCGTemp *ts;
  
  gen_lea_v_seg(s,s->aflag,s->uc->tcg_ctx->cpu_regs[7],0,-1);
  addr = s->A0;
  val = s->T1;
  pTVar2 = s->uc->tcg_ctx;
  if (s->uc->hook[10].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(pTVar2,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(pTVar2,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(pTVar2,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                       0x80);
    tcg_temp_free_internal_x86_64(pTVar2,ts);
  }
  tcg_gen_qemu_ld_i64_x86_64(pTVar2,val,addr,(long)s->mem_index,ot);
  gen_lea_v_seg(s,s->aflag,s->uc->tcg_ctx->cpu_regs[6],3,s->override);
  gen_op(s,7,ot,0x10);
  pTVar2 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar2,INDEX_op_ld32s_i64,(TCGArg)(s->T0 + (long)pTVar2),
                     (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0xac);
  tcg_gen_shli_i64_x86_64(pTVar2,s->T0,s->T0,(ulong)ot);
  MVar1 = s->aflag;
  pTVar2 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar2,INDEX_op_add_i64,(TCGArg)(s->tmp0 + (long)pTVar2),
                     (TCGArg)(pTVar2->cpu_regs[6] + (long)pTVar2),(TCGArg)(s->T0 + (long)pTVar2));
  gen_op_mov_reg_v(s,MVar1,6,s->tmp0);
  MVar1 = s->aflag;
  pTVar2 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar2,INDEX_op_add_i64,(TCGArg)(s->tmp0 + (long)pTVar2),
                     (TCGArg)(pTVar2->cpu_regs[7] + (long)pTVar2),(TCGArg)(s->T0 + (long)pTVar2));
  gen_op_mov_reg_v(s,MVar1,7,s->tmp0);
  return;
}

Assistant:

static inline void gen_cmps(DisasContext *s, MemOp ot)
{
    gen_string_movl_A0_EDI(s);
    gen_op_ld_v(s, ot, s->T1, s->A0);
    gen_string_movl_A0_ESI(s);
    gen_op(s, OP_CMPL, ot, OR_TMP0);
    gen_op_movl_T0_Dshift(s, ot);
    gen_op_add_reg_T0(s, s->aflag, R_ESI);
    gen_op_add_reg_T0(s, s->aflag, R_EDI);
}